

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::File>_>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::File>_> *this,
          void *pointer)

{
  long lVar1;
  undefined8 uVar2;
  long *plVar3;
  size_t in_RCX;
  int fd;
  StringPtr path;
  
  if (pointer != (void *)0x0) {
    if (*(char *)((long)pointer + 0x58) == '\0') {
      lVar1 = *(long *)((long)pointer + 0x30);
      if (lVar1 == 0) {
        fd = 0x54bab9;
      }
      else {
        fd = (int)*(undefined8 *)((long)pointer + 0x28);
      }
      path.content.ptr = (char *)(lVar1 + (ulong)(lVar1 == 0));
      path.content.size_ = in_RCX;
      anon_unknown_9::rmrf((anon_unknown_9 *)(ulong)**(uint **)((long)pointer + 0x20),fd,path);
    }
    lVar1 = *(long *)((long)pointer + 0x40);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)pointer + 0x48);
      *(undefined8 *)((long)pointer + 0x40) = 0;
      *(undefined8 *)((long)pointer + 0x48) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x50))
                (*(undefined8 **)((long)pointer + 0x50),lVar1,1,uVar2,uVar2,0);
    }
    lVar1 = *(long *)((long)pointer + 0x28);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)pointer + 0x30);
      *(undefined8 *)((long)pointer + 0x28) = 0;
      *(undefined8 *)((long)pointer + 0x30) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x38))
                (*(undefined8 **)((long)pointer + 0x38),lVar1,1,uVar2,uVar2,0);
    }
    plVar3 = *(long **)((long)pointer + 0x18);
    if (plVar3 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x18) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x10))
                (*(undefined8 **)((long)pointer + 0x10),(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    operator_delete(pointer,0x60);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }